

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::extract_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,size_t root_id)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  pointer pNVar6;
  pointer pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  _Elt_pointer ppVar11;
  undefined8 local_a8;
  uint local_9c;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_98;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_90;
  size_t root_id_local;
  stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  stack;
  
  local_98 = this;
  root_id_local = root_id;
  if (root_id != 0) {
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::emplace_back<>(&__return_storage_ptr__->nodes);
    std::
    stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    stack<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&stack);
    local_a8 = (ulong)local_a8._4_4_ << 0x20;
    std::
    deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long&,int>
              ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&stack,&root_id_local,(int *)&local_a8);
    local_90.container = &__return_storage_ptr__->prim_ids;
    while (stack.c.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           stack.c.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVar11 = stack.c.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar11 = stack.c.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      uVar4 = ppVar11[-1].first;
      uVar5 = ppVar11[-1].second;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&stack.c);
      pNVar6 = (local_98->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar7 = (__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = *(undefined8 *)pNVar6[uVar4].bounds._M_elems;
      uVar9 = *(undefined8 *)((long)pNVar6[uVar4].bounds._M_elems + 8);
      pfVar1 = (float *)((long)pNVar6[uVar4].bounds._M_elems + 0xc);
      uVar10 = *(undefined8 *)(pfVar1 + 2);
      pfVar2 = (float *)((long)pNVar7[uVar5].bounds._M_elems + 0xc);
      *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
      *(undefined8 *)(pfVar2 + 2) = uVar10;
      *(undefined8 *)pNVar7[uVar5].bounds._M_elems = uVar8;
      *(undefined8 *)((long)pNVar7[uVar5].bounds._M_elems + 8) = uVar9;
      if ((pNVar6[uVar4].index.value & 0xf) == 0) {
        Index<32UL,_4UL>::Index
                  ((Index<32UL,_4UL> *)&local_a8,
                   ((long)(__return_storage_ptr__->nodes).
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->nodes).
                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x1c,
                   (ulong)(pNVar7[uVar5].index.value & 0xf));
        pNVar7[uVar5].index.value = local_a8._0_4_;
        local_9c = pNVar6[uVar4].index.value >> 4;
        local_a8 = ((long)(__return_storage_ptr__->nodes).
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->nodes).
                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_int,unsigned_long>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&stack,&local_9c,(unsigned_long *)&local_a8);
        local_9c = (pNVar6[uVar4].index.value >> 4) + 1;
        local_a8 = ((long)(__return_storage_ptr__->nodes).
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->nodes).
                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x1c + 1;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_int,unsigned_long>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&stack,&local_9c,(unsigned_long *)&local_a8);
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::emplace_back<>(&__return_storage_ptr__->nodes);
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::emplace_back<>(&__return_storage_ptr__->nodes);
      }
      else {
        Index<32UL,_4UL>::Index
                  ((Index<32UL,_4UL> *)&local_a8,
                   (long)(__return_storage_ptr__->prim_ids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->prim_ids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,
                   (ulong)(pNVar7[uVar5].index.value & 0xf));
        pNVar7[uVar5].index.value = local_a8._0_4_;
        uVar3 = pNVar6[uVar4].index.value;
        std::
        copy_n<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_int,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((unsigned_long *)
                   ((ulong)((uVar3 >> 4) << 3) +
                   (long)(local_98->prim_ids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start),uVar3 & 0xf,local_90);
      }
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&stack);
    return __return_storage_ptr__;
  }
  __assert_fail("root_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/bvh.h"
                ,0x5d,
                "Bvh<Node> bvh::v2::Bvh<bvh::v2::Node<float, 3>>::extract_bvh(size_t) const [Node = bvh::v2::Node<float, 3>]"
               );
}

Assistant:

Bvh<Node> Bvh<Node>::extract_bvh(size_t root_id) const {
    assert(root_id != 0);

    Bvh bvh;
    bvh.nodes.emplace_back();

    std::stack<std::pair<size_t, size_t>> stack;
    stack.emplace(root_id, 0);
    while (!stack.empty()) {
        auto [src_id, dst_id] = stack.top();
        stack.pop();
        const auto& src_node = nodes[src_id];
        auto& dst_node = bvh.nodes[dst_id];
        dst_node = src_node;
        if (src_node.is_leaf()) {
            dst_node.index.set_first_id(bvh.prim_ids.size());
            std::copy_n(
                prim_ids.begin() + src_node.index.first_id(),
                src_node.index.prim_count(),
                std::back_inserter(bvh.prim_ids));
        } else {
            dst_node.index.set_first_id(bvh.nodes.size());
            stack.emplace(src_node.index.first_id() + 0, bvh.nodes.size() + 0);
            stack.emplace(src_node.index.first_id() + 1, bvh.nodes.size() + 1);
            // Note: This may invalidate `dst_node` so has to happen after any access to it.
            bvh.nodes.emplace_back();
            bvh.nodes.emplace_back();
        }
    }
    return bvh;
}